

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

bool __thiscall Analyzer::nameLooksLikeFunctionMustReturnResult(Analyzer *this,char *name)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  
  if ((name == (char *)0x0) || (*name == '\0')) {
    bVar2 = false;
  }
  else {
    bVar1 = settings::has_prefix
                      (name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)settings::function_should_return_bool_prefix_abi_cxx11_);
    bVar2 = true;
    if (!bVar1) {
      bVar2 = settings::has_prefix
                        (name,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)settings::function_should_return_something_prefix_abi_cxx11_);
    }
    if (bVar2 == false) {
      pcVar4 = strstr(name,"_ctor");
      if ((pcVar4 == (char *)0x0) && (pcVar4 = strstr(name,"Ctor"), pcVar4 == (char *)0x0)) {
        return false;
      }
      iVar3 = strncmp(name,"set",3);
      bVar2 = iVar3 != 0;
    }
  }
  return bVar2;
}

Assistant:

bool nameLooksLikeFunctionMustReturnResult(const char * name)
  {
    if (!name || !name[0])
      return false;

    bool nameInList = nameLooksLikeResultMustBeBoolean(name) ||
      settings::has_prefix(name, settings::function_should_return_something_prefix);

    if (!nameInList)
      if ((strstr(name, "_ctor") || strstr(name, "Ctor")) && strstr(name, "set") != name)
        nameInList = true;

    return nameInList;
  }